

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::SetEmissionSystem
          (Electromagnetic_Emission_PDU *this,
          vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
          *ES)

{
  KUINT16 *pKVar1;
  EmissionSystem *pEVar2;
  byte bVar3;
  EmissionSystem *this_00;
  
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  operator=(&this->m_vEmissionSystem,ES);
  this_00 = (this->m_vEmissionSystem).
            super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui8NumberOfEmissionSystems = (char)((uint)((int)pEVar2 - (int)this_00) >> 4) * -0x33;
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  for (; pEVar2 != this_00; this_00 = this_00 + 1) {
    bVar3 = DATA_TYPE::EmissionSystem::GetSystemDataLength(this_00);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (ushort)bVar3 * 4;
  }
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::SetEmissionSystem( const vector<EmissionSystem> & ES )
{
    m_vEmissionSystem = ES;
    m_ui8NumberOfEmissionSystems = m_vEmissionSystem.size();

    // Data length values are in 32 bits so multiply by 4 to get the PDU length
    // which is stored in octets.
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetSystemDataLength() * 4;
    }
}